

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchSuccess(int iters,int nbytes,char *regexp,SearchImpl *search)

{
  string s;
  StringPiece local_30;
  
  StopBenchmarkTiming();
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  MakeText(&s,nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  local_30.ptr_ = s._M_dataplus._M_p;
  local_30.length_ = (int)s._M_string_length;
  (*search)(iters,regexp,&local_30,kAnchored,true);
  SetBenchmarkBytesProcessed((long)nbytes * (long)iters);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void SearchSuccess(int iters, int nbytes, const char* regexp, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  MakeText(&s, nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, regexp, s, Prog::kAnchored, true);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}